

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_sine.c
# Opt level: O2

int patestCallback(void *inputBuffer,void *outputBuffer,unsigned_long framesPerBuffer,
                  PaStreamCallbackTimeInfo *timeInfo,PaStreamCallbackFlags statusFlags,
                  void *userData)

{
  long lVar1;
  int iVar2;
  unsigned_long uVar3;
  int iVar4;
  float *out;
  uint uVar5;
  
  for (uVar3 = 0; framesPerBuffer != uVar3; uVar3 = uVar3 + 1) {
    lVar1 = *(long *)((long)userData + 800);
    iVar4 = (int)lVar1;
    *(undefined4 *)((long)outputBuffer + uVar3 * 8) =
         *(undefined4 *)((long)userData + (long)iVar4 * 4);
    *(undefined4 *)((long)outputBuffer + uVar3 * 8 + 4) =
         *(undefined4 *)((long)userData + (lVar1 >> 0x20) * 4);
    iVar2 = (int)((ulong)lVar1 >> 0x20);
    uVar5 = -(uint)(0xc4 < iVar2);
    *(ulong *)((long)userData + 800) =
         CONCAT44((uVar5 & 0xffffff3b | ~uVar5 & 3) + iVar2,
                  (-(uint)(0xc6 < iVar4) & 0xffffff39 | ~-(uint)(0xc6 < iVar4) & 1) + iVar4);
  }
  return 0;
}

Assistant:

static int patestCallback( const void *inputBuffer, void *outputBuffer,
                            unsigned long framesPerBuffer,
                            const PaStreamCallbackTimeInfo* timeInfo,
                            PaStreamCallbackFlags statusFlags,
                            void *userData )
{
    paTestData *data = (paTestData*)userData;
    float *out = (float*)outputBuffer;
    unsigned long i;

    (void) timeInfo; /* Prevent unused variable warnings. */
    (void) statusFlags;
    (void) inputBuffer;
    
    for( i=0; i<framesPerBuffer; i++ )
    {
        *out++ = data->sine[data->left_phase];  /* left */
        *out++ = data->sine[data->right_phase];  /* right */
        data->left_phase += 1;
        if( data->left_phase >= TABLE_SIZE ) data->left_phase -= TABLE_SIZE;
        data->right_phase += 3; /* higher pitch so we can distinguish left and right. */
        if( data->right_phase >= TABLE_SIZE ) data->right_phase -= TABLE_SIZE;
    }
    
    return paContinue;
}